

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::setAddressReceiveRequest
          (WalletImpl *this,CTxDestination *dest,string *id,string *value)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  CWallet *this_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RCX;
  string *in_RDI;
  long in_FS_OFFSET;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  WalletDatabase *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  string *id_00;
  char *in_stack_ffffffffffffffa0;
  WalletBatch *in_stack_ffffffffffffffa8;
  CWallet *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  id_00 = (string *)&in_RDI->field_2;
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RCX,(AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffb0,
             (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(int)((ulong)id_00 >> 0x20)
             ,SUB81((ulong)id_00 >> 0x18,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  this_00 = (CWallet *)
            CWallet::GetDatabase
                      ((CWallet *)
                       CONCAT17(in_stack_ffffffffffffff8f,
                                CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT15(in_stack_ffffffffffffff8d,
                                                  CONCAT14(in_stack_ffffffffffffff8c,
                                                           in_stack_ffffffffffffff88)))));
  WalletBatch::WalletBatch
            ((WalletBatch *)
             CONCAT17(in_stack_ffffffffffffff8f,
                      CONCAT16(in_stack_ffffffffffffff8e,
                               CONCAT15(in_stack_ffffffffffffff8d,
                                        CONCAT14(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                )))),in_stack_ffffffffffffff80,
             (bool)in_stack_ffffffffffffff7f);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (bVar2) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar3 = CWallet::EraseAddressReceiveRequest
                      (this_00,(WalletBatch *)id_00,(CTxDestination *)in_RDI,
                       (string *)
                       CONCAT17(in_stack_ffffffffffffff8f,
                                CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT15(in_stack_ffffffffffffff8d,
                                                  CONCAT14(in_stack_ffffffffffffff8c,
                                                           in_stack_ffffffffffffff88)))));
  }
  else {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar3 = CWallet::SetAddressReceiveRequest
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(CTxDestination *)this_00
                       ,id_00,in_RDI);
  }
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool setAddressReceiveRequest(const CTxDestination& dest, const std::string& id, const std::string& value) override {
        // Note: The setAddressReceiveRequest interface used by the GUI to store
        // receive requests is a little awkward and could be improved in the
        // future:
        //
        // - The same method is used to save requests and erase them, but
        //   having separate methods could be clearer and prevent bugs.
        //
        // - Request ids are passed as strings even though they are generated as
        //   integers.
        //
        // - Multiple requests can be stored for the same address, but it might
        //   be better to only allow one request or only keep the current one.
        LOCK(m_wallet->cs_wallet);
        WalletBatch batch{m_wallet->GetDatabase()};
        return value.empty() ? m_wallet->EraseAddressReceiveRequest(batch, dest, id)
                             : m_wallet->SetAddressReceiveRequest(batch, dest, id, value);
    }